

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# film.cpp
# Opt level: O0

Image * __thiscall pbrt::RGBFilm::GetImage(RGBFilm *this,ImageMetadata *metadata,Float splatScale)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  v;
  char *in_RSI;
  Image *in_RDI;
  PixelFormat format;
  Image *image;
  Bounds2<int> *in_stack_fffffffffffffe38;
  optional<pbrt::Bounds2<int>_> *in_stack_fffffffffffffe40;
  iterator in_stack_fffffffffffffe48;
  function<void_(pbrt::Point2<int>)> *in_stack_fffffffffffffe50;
  allocator<char> *in_stack_fffffffffffffe70;
  char *in_stack_fffffffffffffe78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe80;
  _Any_data *extent;
  _Any_data *local_178;
  undefined8 in_stack_fffffffffffffee0;
  Bounds2<int> *local_e8;
  allocator<char> local_d6;
  allocator<char> local_d5 [20];
  allocator<char> local_c1;
  undefined1 *local_c0;
  undefined1 local_b8 [8];
  undefined8 in_stack_ffffffffffffff50;
  PixelFormat in_stack_ffffffffffffff5c;
  Image *in_stack_ffffffffffffff60;
  Allocator in_stack_ffffffffffffff68;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_ffffffffffffff70;
  Tuple2<pbrt::Point2,_int> in_stack_ffffffffffffff80;
  undefined1 local_78 [32];
  _Any_data local_58 [2];
  Tuple2<pbrt::Vector2,_int> local_34;
  undefined1 local_21;
  int local_20;
  
  if (LOGGING_LogLevel < 1) {
    Log((LogLevel)((ulong)in_stack_fffffffffffffee0 >> 0x20),in_RSI,(int)((ulong)in_RDI >> 0x20),
        (char *)in_RDI);
  }
  local_20 = 2 - ((byte)in_RSI[0x5c] & 1);
  local_21 = 0;
  local_34 = (Tuple2<pbrt::Vector2,_int>)Bounds2<int>::Diagonal(in_stack_fffffffffffffe38);
  Point2<int>::Point2<int>
            ((Point2<int> *)in_stack_fffffffffffffe40,(Vector2<int> *)in_stack_fffffffffffffe38);
  local_c0 = local_b8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffe80,in_stack_fffffffffffffe78,in_stack_fffffffffffffe70);
  local_c0 = &stack0xffffffffffffff68;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffe80,in_stack_fffffffffffffe78,in_stack_fffffffffffffe70);
  local_c0 = local_78;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffe80,in_stack_fffffffffffffe78,in_stack_fffffffffffffe70);
  local_58[0]._0_8_ = local_b8;
  local_58[0]._8_8_ = 3;
  v._M_len = (size_type)in_stack_fffffffffffffe50;
  v._M_array = in_stack_fffffffffffffe48;
  pstd::span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::span((span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)in_stack_fffffffffffffe40,v);
  ColorEncodingHandle::TaggedPointer
            ((ColorEncodingHandle *)in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
  pstd::pmr::polymorphic_allocator<std::byte>::polymorphic_allocator
            ((polymorphic_allocator<std::byte> *)in_stack_fffffffffffffe40);
  Image::Image(in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c,
               (Point2i)in_stack_ffffffffffffff80,in_stack_ffffffffffffff70,
               (ColorEncodingHandle *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff68);
  extent = (_Any_data *)local_b8;
  local_178 = local_58;
  do {
    local_178 = local_178 + -2;
    std::__cxx11::string::~string((string *)local_178->_M_pod_data);
  } while (local_178 != extent);
  std::allocator<char>::~allocator(&local_d6);
  std::allocator<char>::~allocator(local_d5);
  std::allocator<char>::~allocator(&local_c1);
  std::function<void(pbrt::Point2<int>)>::
  function<pbrt::RGBFilm::GetImage(pbrt::ImageMetadata*,float)::__0,void>
            (in_stack_fffffffffffffe50,(anon_class_24_3_3a44ecd8 *)in_stack_fffffffffffffe48);
  ParallelFor2D((Bounds2i *)extent,(function<void_(pbrt::Point2<int>)> *)local_178);
  std::function<void_(pbrt::Point2<int>)>::~function((function<void_(pbrt::Point2<int>)> *)0x75b2f5)
  ;
  pstd::optional<pbrt::Bounds2<int>_>::operator=(in_stack_fffffffffffffe40,local_e8);
  pstd::optional<pbrt::Point2<int>_>::operator=
            ((optional<pbrt::Point2<int>_> *)in_stack_fffffffffffffe40,&local_e8->pMin);
  pstd::optional<const_pbrt::RGBColorSpace_*>::operator=
            ((optional<const_pbrt::RGBColorSpace_*> *)in_stack_fffffffffffffe40,
             (RGBColorSpace **)local_e8);
  return in_RDI;
}

Assistant:

Image RGBFilm::GetImage(ImageMetadata *metadata, Float splatScale) {
    // Convert image to RGB and compute final pixel values
    LOG_VERBOSE("Converting image to RGB and computing final weighted pixel values");
    PixelFormat format = writeFP16 ? PixelFormat::Half : PixelFormat::Float;
    Image image(format, Point2i(pixelBounds.Diagonal()), {"R", "G", "B"});

    ParallelFor2D(pixelBounds, [&](Point2i p) {
        RGB rgb = GetPixelRGB(p, splatScale);

        Point2i pOffset(p.x - pixelBounds.pMin.x, p.y - pixelBounds.pMin.y);
        image.SetChannels(pOffset, {rgb[0], rgb[1], rgb[2]});
    });

    metadata->pixelBounds = pixelBounds;
    metadata->fullResolution = fullResolution;
    metadata->colorSpace = colorSpace;

    return image;
}